

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::SamplePosQueryCase::iterate(SamplePosQueryCase *this)

{
  bool bVar1;
  float fVar2;
  int iVar3;
  GLenum err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  RenderTarget *this_00;
  float *pfVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_1c8;
  Vector<float,_2> local_48;
  Vec2 samplePos;
  int ndx;
  undefined1 local_28 [7];
  bool error;
  CallLogWrapper gl;
  SamplePosQueryCase *this_local;
  
  gl._16_8_ = this;
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_28,(Functions *)CONCAT44(extraout_var,iVar3),pTVar5);
  bVar1 = false;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_28,true);
  samplePos.m_data[0] = 0.0;
  do {
    fVar2 = samplePos.m_data[0];
    this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar3 = tcu::RenderTarget::getNumSamples(this_00);
    if (iVar3 <= (int)fVar2) {
      if (bVar1) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid sample pos");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_28);
      return STOP;
    }
    tcu::Vector<float,_2>::Vector(&local_48,-1.0,-1.0);
    fVar2 = samplePos.m_data[0];
    pfVar6 = tcu::Vector<float,_2>::getPtr(&local_48);
    glu::CallLogWrapper::glGetMultisamplefv((CallLogWrapper *)local_28,0x8e50,(GLuint)fVar2,pfVar6);
    err = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
    glu::checkError(err,"getMultisamplefv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x90);
    pfVar6 = tcu::Vector<float,_2>::x(&local_48);
    if (*pfVar6 <= 0.0 && *pfVar6 != 0.0) {
LAB_00848fd8:
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1c8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [8])"Sample ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&samplePos);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [35])" is not in valid range [0,1], got ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_48);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      bVar1 = true;
    }
    else {
      pfVar6 = tcu::Vector<float,_2>::x(&local_48);
      if (1.0 < *pfVar6) goto LAB_00848fd8;
      pfVar6 = tcu::Vector<float,_2>::y(&local_48);
      if (*pfVar6 <= 0.0 && *pfVar6 != 0.0) goto LAB_00848fd8;
      pfVar6 = tcu::Vector<float,_2>::y(&local_48);
      if (1.0 < *pfVar6) goto LAB_00848fd8;
    }
    samplePos.m_data[0] = (float)((int)samplePos.m_data[0] + 1);
  } while( true );
}

Assistant:

SamplePosQueryCase::IterateResult SamplePosQueryCase::iterate (void)
{
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	bool				error	= false;

	gl.enableLogging(true);

	for (int ndx = 0; ndx < m_context.getRenderTarget().getNumSamples(); ++ndx)
	{
		tcu::Vec2 samplePos = tcu::Vec2(-1, -1);

		gl.glGetMultisamplefv(GL_SAMPLE_POSITION, ndx, samplePos.getPtr());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getMultisamplefv");

		// check value range
		if (samplePos.x() < 0.0f || samplePos.x() > 1.0f ||
			samplePos.y() < 0.0f || samplePos.y() > 1.0f)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Sample " << ndx << " is not in valid range [0,1], got " << samplePos << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid sample pos");

	return STOP;
}